

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O1

void __thiscall
icu_63::CollationSettings::setReorderArrays
          (CollationSettings *this,int32_t *codes,int32_t codesLength,uint32_t *ranges,
          int32_t rangesLength,uint8_t *table,UErrorCode *errorCode)

{
  int32_t *__dest;
  uint uVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->reorderCodesCapacity < rangesLength + codesLength) {
      uVar1 = rangesLength + codesLength + 3U & 0xfffffffc;
      __dest = (int32_t *)uprv_malloc_63((long)(int)(uVar1 * 4 + 0x100));
      if (__dest == (int32_t *)0x0) {
        this->reorderTable = (uint8_t *)0x0;
        this->minHighNoReorder = 0;
        this->reorderRangesLength = 0;
        this->reorderCodesLength = 0;
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        if (this->reorderCodesCapacity != 0) {
          uprv_free_63(this->reorderCodes);
        }
        this->reorderCodes = __dest;
        this->reorderCodesCapacity = uVar1;
      }
      if (__dest == (int32_t *)0x0) {
        return;
      }
    }
    else {
      __dest = this->reorderCodes;
    }
    memcpy(__dest + this->reorderCodesCapacity,table,0x100);
    memcpy(__dest,codes,(long)(codesLength * 4));
    memcpy(__dest + codesLength,ranges,(long)(rangesLength * 4));
    this->reorderTable = (uint8_t *)(this->reorderCodes + this->reorderCodesCapacity);
    this->reorderCodesLength = codesLength;
    this->reorderRanges = (uint32_t *)(__dest + codesLength);
    this->reorderRangesLength = rangesLength;
  }
  return;
}

Assistant:

void
CollationSettings::setReorderArrays(const int32_t *codes, int32_t codesLength,
                                    const uint32_t *ranges, int32_t rangesLength,
                                    const uint8_t *table, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    int32_t *ownedCodes;
    int32_t totalLength = codesLength + rangesLength;
    U_ASSERT(totalLength > 0);
    if(totalLength <= reorderCodesCapacity) {
        ownedCodes = const_cast<int32_t *>(reorderCodes);
    } else {
        // Allocate one memory block for the codes, the ranges, and the 16-aligned table.
        int32_t capacity = (totalLength + 3) & ~3;  // round up to a multiple of 4 ints
        ownedCodes = (int32_t *)uprv_malloc(capacity * 4 + 256);
        if(ownedCodes == NULL) {
            resetReordering();
            errorCode = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if(reorderCodesCapacity != 0) {
            uprv_free(const_cast<int32_t *>(reorderCodes));
        }
        reorderCodes = ownedCodes;
        reorderCodesCapacity = capacity;
    }
    uprv_memcpy(ownedCodes + reorderCodesCapacity, table, 256);
    uprv_memcpy(ownedCodes, codes, codesLength * 4);
    uprv_memcpy(ownedCodes + codesLength, ranges, rangesLength * 4);
    reorderTable = reinterpret_cast<const uint8_t *>(reorderCodes + reorderCodesCapacity);
    reorderCodesLength = codesLength;
    reorderRanges = reinterpret_cast<uint32_t *>(ownedCodes) + codesLength;
    reorderRangesLength = rangesLength;
}